

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<capnp::compiler::Compiler::CompiledType> * __thiscall
capnp::compiler::Compiler::CompiledType::applyBrand
          (Maybe<capnp::compiler::Compiler::CompiledType> *__return_storage_ptr__,CompiledType *this
          ,Array<capnp::compiler::Compiler::CompiledType> *arguments)

{
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *pMVar1;
  Compiler *pCVar2;
  size_t sVar3;
  Reader subSource;
  undefined1 auVar4 [40];
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *pEVar5;
  char cVar6;
  BrandScope *pBVar7;
  undefined8 uVar8;
  BrandedDecl *pBVar9;
  Mutex *pMVar10;
  long lVar11;
  NullableValue<capnp::compiler::BrandedDecl> _member1422;
  Array<capnp::compiler::BrandedDecl> args;
  Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  ArrayBuilder<capnp::compiler::BrandedDecl> builder;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  Compiler *local_380;
  undefined1 local_378 [16];
  anon_union_96_1_a8a2e026_for_OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_2
  local_368;
  BrandScope *pBStack_308;
  BrandScope *pBStack_300;
  SegmentReader *pSStack_2f8;
  WirePointer *pWStack_2f0;
  WirePointer *local_2e8;
  WirePointer *pWStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  long local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b8;
  Mutex *local_2a8;
  Own<capnp::compiler::Compiler::Impl,_std::nullptr_t> *local_2a0;
  Array<capnp::compiler::BrandedDecl> local_298;
  BrandedDecl *local_278;
  anon_union_168_1_a8c68091_for_NullableValue<capnp::compiler::BrandedDecl>_2 local_270;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_1c8;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_118;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_118.mutex = (Mutex *)0x0;
  local_118.value.body.tag = 0;
  local_118.value.brand.disposer = (Disposer *)0x0;
  local_118.value.brand.ptr = (BrandScope *)0x0;
  local_118.value.source._reader.segment = (SegmentReader *)0x0;
  local_118.value.source._reader.capTable = (CapTableReader *)0x0;
  local_118.value.source._reader.data = (WirePointer *)0x0;
  local_118.value.source._reader.pointers._0_6_ = 0;
  local_118.value.source._reader.pointers._6_2_ = 0;
  local_118.value.source._reader.dataSize = 0;
  local_118.value.source._reader.pointerCount = 0;
  local_118.value.source._reader.nestingLimit = 0x7fffffff;
  pCVar2 = this->compiler;
  pMVar1 = &pCVar2->impl;
  local_380 = (Compiler *)((ulong)local_380 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&pMVar1->mutex);
  local_2a0 = &(pCVar2->impl).value;
  sVar3 = *(size_t *)(arguments + 8);
  local_2a8 = &pMVar1->mutex;
  local_278 = (BrandedDecl *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0xa8,0,sVar3,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_270._8_8_ = local_278 + sVar3;
  local_270._16_8_ = &kj::_::HeapArrayDisposer::instance;
  local_270._0_8_ = local_278;
  if (*(long *)(arguments + 8) != 0) {
    lVar11 = *(long *)arguments;
    do {
      BrandedDecl::BrandedDecl((BrandedDecl *)&local_380,(BrandedDecl *)(lVar11 + 0x10));
      *(uint *)local_270._0_8_ = (uint)local_380;
      if ((uint)local_380 == 2) {
        *(undefined8 *)(local_270._0_8_ + 8) = local_378._0_8_;
        *(undefined8 *)(local_270._0_8_ + 0x10) = local_378._8_8_;
      }
      else if ((uint)local_380 == 1) {
        *(undefined8 *)(local_270._0_8_ + 0x28) = local_368._16_8_;
        *(undefined8 *)(local_270._0_8_ + 0x18) = local_368._0_8_;
        *(undefined8 *)(local_270._0_8_ + 0x20) = local_368._8_8_;
        *(undefined8 *)(local_270._0_8_ + 8) = local_378._0_8_;
        *(undefined8 *)(local_270._0_8_ + 0x10) = local_378._8_8_;
        *(byte *)(local_270._0_8_ + 0x30) = local_368.space[0x18];
        if (local_368.space[0x18] == '\x01') {
          *(undefined8 *)(local_270._0_8_ + 0x58) = local_368._64_8_;
          *(undefined8 *)(local_270._0_8_ + 0x60) = local_368._72_8_;
          *(undefined8 *)(local_270._0_8_ + 0x48) = local_368._48_8_;
          *(undefined8 *)(local_270._0_8_ + 0x50) = local_368._56_8_;
          *(undefined8 *)(local_270._0_8_ + 0x38) = local_368._32_8_;
          *(undefined8 *)(local_270._0_8_ + 0x40) = local_368._40_8_;
          local_368._24_8_ = local_368._24_8_ & 0xffffffffffffff00;
        }
      }
      *(undefined8 *)(local_270._0_8_ + 0x68) = local_368._80_8_;
      *(undefined8 *)(local_270._0_8_ + 0x70) = local_368._88_8_;
      local_368._88_8_ = (BrandScope *)0x0;
      *(WirePointer **)(local_270._0_8_ + 0x98) = local_2e8;
      *(WirePointer **)(local_270._0_8_ + 0xa0) = pWStack_2e0;
      *(SegmentReader **)(local_270._0_8_ + 0x88) = pSStack_2f8;
      *(WirePointer **)(local_270._0_8_ + 0x90) = pWStack_2f0;
      *(BrandScope **)(local_270._0_8_ + 0x78) = pBStack_308;
      *(BrandScope **)(local_270._0_8_ + 0x80) = pBStack_300;
      local_270._0_8_ = local_270._0_8_ + 0xa8;
      if ((uint)local_380 == 1) {
        local_380 = (Compiler *)((ulong)local_380 & 0xffffffff00000000);
      }
      if ((uint)local_380 == 2) {
        local_380 = (Compiler *)((ulong)local_380 & 0xffffffff00000000);
      }
      lVar11 = lVar11 + 0xb8;
    } while (lVar11 != *(long *)(arguments + 8) * 0xb8 + *(long *)arguments);
  }
  local_298.size_ = (local_270._0_8_ - (long)local_278 >> 3) * -0x30c30c30c30c30c3;
  local_2b8 = (undefined8 *)local_270._16_8_;
  local_298.ptr = local_278;
  local_298.disposer = (ArrayDisposer *)local_270._16_8_;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_48 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_40 = 0x7fffffff;
  auVar4 = ZEXT1640(ZEXT816(0));
  subSource._reader._40_8_ = 0x7fffffff;
  subSource._reader.segment = (SegmentReader *)auVar4._0_8_;
  subSource._reader.capTable = (CapTableReader *)auVar4._8_8_;
  subSource._reader.data = (void *)auVar4._16_8_;
  subSource._reader.pointers = (WirePointer *)auVar4._24_8_;
  subSource._reader.dataSize = auVar4._32_4_;
  subSource._reader.pointerCount = auVar4._36_2_;
  subSource._reader._38_2_ = auVar4._38_2_;
  BrandedDecl::applyParams
            ((Maybe<capnp::compiler::BrandedDecl> *)&local_278,&(this->decl).value,&local_298,
             subSource);
  uVar8 = local_270.value.brand.ptr;
  sVar3 = local_298.size_;
  pBVar9 = local_298.ptr;
  local_380 = (Compiler *)CONCAT71(local_380._1_7_,local_278._0_1_);
  if (local_278._0_1_ == true) {
    local_378._0_4_ = local_270.value.body.tag;
    if (local_270.value.body.tag == 2) {
      local_378._8_8_ = local_270._8_8_;
      local_368._0_8_ = local_270._16_8_;
    }
    else if (local_270.value.body.tag == 1) {
      local_368._24_8_ = local_270._40_8_;
      local_368._8_8_ = local_270._24_8_;
      local_368._16_8_ = local_270._32_8_;
      local_378._8_8_ = local_270._8_8_;
      local_368._0_8_ = local_270._16_8_;
      local_368.space[0x20] = local_270._48_1_;
      if (local_270._48_1_ == '\x01') {
        local_368._72_8_ = local_270._88_8_;
        local_368._80_8_ = local_270._96_8_;
        local_368._56_8_ = local_270._72_8_;
        local_368._64_8_ = local_270._80_8_;
        local_368._40_8_ = local_270._56_8_;
        local_368._48_8_ = local_270._64_8_;
        local_270._48_1_ = '\0';
      }
    }
    local_368._92_4_ = local_270._108_4_;
    local_368._88_4_ = local_270._104_4_;
    pBStack_300 = (BrandScope *)CONCAT44(local_270._124_4_,local_270._120_4_);
    pSStack_2f8 = (SegmentReader *)CONCAT44(local_270._132_4_,local_270._128_4_);
    pWStack_2f0 = (WirePointer *)CONCAT44(local_270._140_4_,local_270._136_4_);
    local_2e8 = (WirePointer *)CONCAT44(local_270._148_4_,local_270._144_4_);
    pWStack_2e0 = (WirePointer *)CONCAT44(local_270._156_4_,local_270.value.source._reader.dataSize)
    ;
    local_2d8._4_4_ = local_270._164_4_;
    local_2d8._0_4_ = local_270.value.source._reader.nestingLimit;
    local_270.value.brand.ptr = (BrandScope *)0x0;
    pBStack_308 = (BrandScope *)uVar8;
    if (local_270.value.body.tag == 1) {
      local_270._0_8_ = local_270._0_8_ & 0xffffffff00000000;
    }
    if (local_270.value.body.tag == 2) {
      local_270._0_8_ = local_270._0_8_ & 0xffffffff00000000;
    }
  }
  if (local_298.ptr != (BrandedDecl *)0x0) {
    local_298.ptr = (BrandedDecl *)0x0;
    local_298.size_ = 0;
    (**(local_298.disposer)->_vptr_ArrayDisposer)
              (local_298.disposer,pBVar9,0xa8,sVar3,sVar3,
               kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
  }
  cVar6 = (char)local_380;
  if ((char)local_380 == '\x01') {
    local_118.mutex = local_2a8;
    BrandedDecl::operator=(&local_118.value,(BrandedDecl *)local_378);
  }
  pBVar7 = pBStack_308;
  if ((char)local_380 == '\x01') {
    if (pBStack_308 != (BrandScope *)0x0) {
      pBStack_308 = (BrandScope *)0x0;
      (*(code *)**(undefined8 **)local_368._88_8_)
                (local_368._88_8_,
                 (_func_int *)
                 ((long)&(pBVar7->super_Refcounted).super_Disposer._vptr_Disposer +
                 (long)((Arena *)(pBVar7->super_Refcounted).super_Disposer._vptr_Disposer)[-2].
                       _vptr_Arena));
    }
    if (local_378._0_4_ == 1) {
      local_378._0_8_ = local_378._0_8_ & 0xffffffff00000000;
    }
    if (local_378._0_4_ == 2) {
      local_378._0_8_ = local_378._0_8_ & 0xffffffff00000000;
    }
  }
  uVar8 = uStack_2c0;
  lVar11 = local_2c8;
  if (local_2c8 != 0) {
    local_2c8 = 0;
    uStack_2c0 = 0;
    (**(code **)*local_2b8)
              (local_2b8,lVar11,0xa8,uVar8,uVar8,
               kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
  }
  if (local_2a8 != (Mutex *)0x0) {
    kj::_::Mutex::unlock(local_2a8,SHARED,(Waiter *)0x0);
  }
  pBVar7 = local_118.value.brand.ptr;
  pMVar10 = local_118.mutex;
  if (cVar6 == '\0') {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    local_380 = this->compiler;
    local_1c8.value.body.tag = local_118.value.body.tag;
    if (local_118.value.body.tag == 1) {
      local_1c8.value.body.field_1._32_8_ = local_118.value.body.field_1._32_8_;
      local_1c8.value.body.field_1._16_8_ = local_118.value.body.field_1._16_8_;
      local_1c8.value.body.field_1._24_8_ = local_118.value.body.field_1._24_8_;
      local_1c8.value.body.field_1._0_8_ = local_118.value.body.field_1._0_8_;
      local_1c8.value.body.field_1._8_8_ = local_118.value.body.field_1._8_8_;
      local_1c8.value.body.field_1.space[0x28] = local_118.value.body.field_1.space[0x28];
      if (local_118.value.body.field_1.space[0x28] == '\x01') {
        local_1c8.value.body.field_1._80_8_ = local_118.value.body.field_1._80_8_;
        local_1c8.value.body.field_1._88_8_ = local_118.value.body.field_1._88_8_;
        local_1c8.value.body.field_1._64_8_ = local_118.value.body.field_1._64_8_;
        local_1c8.value.body.field_1._72_8_ = local_118.value.body.field_1._72_8_;
        local_1c8.value.body.field_1._48_8_ = local_118.value.body.field_1._48_8_;
        local_1c8.value.body.field_1._56_8_ = local_118.value.body.field_1._56_8_;
        local_118.value.body.field_1.space[0x28] = '\0';
      }
    }
    if (local_118.value.body.tag == 2) {
      local_1c8.value.body.field_1._0_8_ = local_118.value.body.field_1._0_8_;
      local_1c8.value.body.field_1._8_8_ = local_118.value.body.field_1._8_8_;
    }
    local_1c8.value.source._reader.pointers =
         (WirePointer *)
         CONCAT26(local_118.value.source._reader.pointers._6_2_,
                  local_118.value.source._reader.pointers._0_6_);
    local_1c8.value.source._reader._38_2_ = local_118.value.source._reader._38_2_;
    local_1c8.value.source._reader.dataSize = local_118.value.source._reader.dataSize;
    local_1c8.value.source._reader.pointerCount = local_118.value.source._reader.pointerCount;
    local_1c8.value.source._reader._44_4_ = local_118.value.source._reader._44_4_;
    local_1c8.value.source._reader.nestingLimit = local_118.value.source._reader.nestingLimit;
    local_1c8.value.brand.disposer = local_118.value.brand.disposer;
    local_118.value.brand.ptr = (BrandScope *)0x0;
    local_1c8.value.source._reader.segment = local_118.value.source._reader.segment;
    local_1c8.value.source._reader.capTable = local_118.value.source._reader.capTable;
    local_1c8.value.source._reader.data = local_118.value.source._reader.data;
    local_118.mutex = (Mutex *)0x0;
    local_378._8_4_ = local_118.value.body.tag;
    if (local_118.value.body.tag == 1) {
      local_368._32_8_ = local_1c8.value.body.field_1._32_8_;
      local_368._16_8_ = local_1c8.value.body.field_1._16_8_;
      local_368._24_8_ = local_1c8.value.body.field_1._24_8_;
      local_368._0_8_ = local_1c8.value.body.field_1._0_8_;
      local_368._8_8_ = local_1c8.value.body.field_1._8_8_;
      local_368.space[0x28] = local_1c8.value.body.field_1.space[0x28];
      if (local_1c8.value.body.field_1.space[0x28] == '\x01') {
        local_368._80_8_ = local_1c8.value.body.field_1._80_8_;
        local_368._88_8_ = local_1c8.value.body.field_1._88_8_;
        local_368._64_8_ = local_1c8.value.body.field_1._64_8_;
        local_368._72_8_ = local_1c8.value.body.field_1._72_8_;
        local_368._48_8_ = local_1c8.value.body.field_1._48_8_;
        local_368._56_8_ = local_1c8.value.body.field_1._56_8_;
        local_1c8.value.body.field_1.space[0x28] = '\0';
      }
    }
    if (local_118.value.body.tag == 2) {
      local_368._0_8_ = local_1c8.value.body.field_1._0_8_;
      local_368._8_8_ = local_1c8.value.body.field_1._8_8_;
    }
    pBStack_308 = (BrandScope *)local_118.value.brand.disposer;
    local_1c8.value.brand.ptr = (BrandScope *)0x0;
    pWStack_2e0 = (WirePointer *)
                  CONCAT26(local_118.value.source._reader.pointers._6_2_,
                           local_118.value.source._reader.pointers._0_6_);
    local_2d8._6_2_ = local_118.value.source._reader._38_2_;
    local_2d8._0_4_ = local_118.value.source._reader.dataSize;
    local_2d8._4_2_ = local_118.value.source._reader.pointerCount;
    uStack_2d0._4_4_ = local_118.value.source._reader._44_4_;
    uStack_2d0._0_4_ = local_118.value.source._reader.nestingLimit;
    pSStack_2f8 = local_118.value.source._reader.segment;
    pWStack_2f0 = (WirePointer *)local_118.value.source._reader.capTable;
    local_2e8 = (WirePointer *)local_118.value.source._reader.data;
    local_1c8.mutex = (Mutex *)0x0;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.compiler = local_380;
    (__return_storage_ptr__->ptr).field_1.value.decl.mutex = pMVar10;
    *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = local_118.value.body.tag;
    if (local_118.value.body.tag == 1) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x20) =
           local_368._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x10) =
           local_368._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x18) =
           local_368._24_8_;
      *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 =
           local_368._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 8) =
           local_368._8_8_;
      *(byte *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_368.space[0x28];
      if (local_368.space[0x28] == '\x01') {
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x50) =
             local_368._80_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x58) =
             local_368._88_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x40) =
             local_368._64_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x48) =
             local_368._72_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x30) =
             local_368._48_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x38) =
             local_368._56_8_;
        local_368._40_8_ = local_368._40_8_ & 0xffffffffffffff00;
      }
    }
    if (local_118.value.body.tag == 2) {
      *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 =
           local_368._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 8) =
           local_368._8_8_;
    }
    (__return_storage_ptr__->ptr).field_1.value.decl.value.brand.disposer =
         local_118.value.brand.disposer;
    (__return_storage_ptr__->ptr).field_1.value.decl.value.brand.ptr = pBVar7;
    pBStack_300 = (BrandScope *)0x0;
    pEVar5 = &(__return_storage_ptr__->ptr).field_1.value.decl;
    (pEVar5->value).source._reader.dataSize = local_118.value.source._reader.dataSize;
    (pEVar5->value).source._reader.pointerCount = local_118.value.source._reader.pointerCount;
    *(undefined2 *)&(pEVar5->value).source._reader.field_0x26 =
         local_118.value.source._reader._38_2_;
    *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.nestingLimit =
         CONCAT44(local_118.value.source._reader._44_4_,local_118.value.source._reader.nestingLimit)
    ;
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.data =
         local_118.value.source._reader.data;
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.pointers =
         (WirePointer *)
         CONCAT26(local_118.value.source._reader.pointers._6_2_,
                  local_118.value.source._reader.pointers._0_6_);
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.segment =
         local_118.value.source._reader.segment;
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.capTable =
         local_118.value.source._reader.capTable;
    local_378._0_8_ = 0;
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
              ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_378);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_1c8);
  }
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_118);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Compiler::CompiledType> Compiler::CompiledType::applyBrand(
    kj::Array<CompiledType> arguments) {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;
  bool found = false;

  {
    auto lock = compiler.impl.lockShared();
    auto args = KJ_MAP(arg, arguments) { return kj::mv(arg.decl.get(lock)); };
    KJ_IF_SOME(member, decl.get(lock).applyParams(kj::mv(args), {})) {
      newDecl.set(lock, kj::mv(member));
      found = true;
    }
  }

  if (found) {
    return CompiledType(compiler, kj::mv(newDecl));
  } else {
    return kj::none;
  }
}